

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_address_tests.cpp
# Opt level: O1

void __thiscall IpAddressTests_ToFromString_Test::TestBody(IpAddressTests_ToFromString_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  address *address_00;
  char *pcVar4;
  address address;
  AssertionResult gtest_ar;
  address addr;
  string string;
  AssertHelper local_70;
  AssertHelper local_68;
  storage_type local_5c;
  string local_58;
  ip local_34 [4];
  string local_30;
  
  ip::address::address((address *)local_34,0xc6,'\x01','\0','\v');
  ip::to_string_abi_cxx11_(&local_30,local_34,address_00);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[11]>
            ((internal *)&local_58,"string","\"198.1.0.11\"",&local_30,(char (*) [11])"198.1.0.11");
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
               ,0x2a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_70.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_70.data_ + 8))();
      }
      local_70.data_ = (AssertHelperData *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_58._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_58._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"127.192.37.1","");
        local_5c._M_elems = (_Type)ip::from_string(&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Read ip address: ",0x11);
        poVar2 = ip::operator<<((ostream *)&std::cout,(address *)&local_5c);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        local_70.data_ = (AssertHelperData *)((ulong)local_70.data_._4_4_ << 0x20);
        pvVar3 = ip::address::operator[]((address *)&local_5c,(int *)&local_70);
        local_68.data_._0_4_ = 0x7f;
        testing::internal::CmpHelperEQ<unsigned_char,int>
                  ((internal *)&local_58,"address[0]","127",pvVar3,(int *)&local_68);
        if ((char)local_58._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_70);
          if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)local_58._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
                     ,0x31,pcVar4);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if (local_70.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_70.data_ + 8))();
            }
            local_70.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_58._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_70.data_._0_4_ = 1;
        pvVar3 = ip::address::operator[]((address *)&local_5c,(int *)&local_70);
        local_68.data_._0_4_ = 0xc0;
        testing::internal::CmpHelperEQ<unsigned_char,int>
                  ((internal *)&local_58,"address[1]","192",pvVar3,(int *)&local_68);
        if ((char)local_58._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_70);
          if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)local_58._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
                     ,0x32,pcVar4);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if (local_70.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_70.data_ + 8))();
            }
            local_70.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_58._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_70.data_._0_4_ = 2;
        pvVar3 = ip::address::operator[]((address *)&local_5c,(int *)&local_70);
        local_68.data_._0_4_ = 0x25;
        testing::internal::CmpHelperEQ<unsigned_char,int>
                  ((internal *)&local_58,"address[2]","37",pvVar3,(int *)&local_68);
        if ((char)local_58._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_70);
          if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)local_58._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
                     ,0x33,pcVar4);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if (local_70.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_70.data_ + 8))();
            }
            local_70.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_58._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_70.data_._0_4_ = 3;
        pvVar3 = ip::address::operator[]((address *)&local_5c,(int *)&local_70);
        local_68.data_._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_char,int>
                  ((internal *)&local_58,"address[3]","1",pvVar3,(int *)&local_68);
        if ((char)local_58._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_70);
          if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)local_58._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
                     ,0x34,pcVar4);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if (local_70.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_70.data_ + 8))();
            }
            local_70.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_58._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
    else {
      testing::Message::Message((Message *)&local_58);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
                 ,0x36,
                 "Expected: { ip::address address = ip::from_string(\"127.192.37.1\"); std::cout << \"Read ip address: \" << address << std::endl; switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal:: EqHelper<(sizeof(::testing::internal::IsNullLiteralHelper(address[0])) == 1)>::Compare(\"address[0]\", \"127\", address[0], 127))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp\", 49, gtest_ar.failure_message()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal:: EqHelper<(sizeof(::testing::internal::IsNullLiteralHelper(address[1])) == 1)>::Compare(\"address[1]\", \"192\", address[1], 192))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp\", 50, gtest_ar.failure_message()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal:: EqHelper<(sizeof(::testing::internal::IsNullLiteralHelper(address[2])) == 1)>::Compare(\"address[2]\", \"37\", address[2], 37))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp\", 51, gtest_ar.failure_message()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal:: EqHelper<(sizeof(::testing::internal::IsNullLiteralHelper(address[3])) == 1)>::Compare(\"address[3]\", \"1\", address[3], 1))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-c..." /* TRUNCATED STRING LITERAL */
                );
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0)) {
          (**(code **)(*(size_type *)local_58._M_dataplus._M_p + 8))();
        }
        local_58._M_dataplus._M_p = (pointer)0x0;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(IpAddressTests, ToFromString)
{
    // to string
    const ip::address addr = { 198, 1, 0, 11 };
    auto string = ip::to_string(addr);
    ASSERT_EQ(string, "198.1.0.11");

    // from string
    EXPECT_NO_THROW(
        {
            ip::address address = ip::from_string("127.192.37.1");
            std::cout << "Read ip address: " << address << std::endl;
            EXPECT_EQ(address[0], 127);
            EXPECT_EQ(address[1], 192);
            EXPECT_EQ(address[2], 37);
            EXPECT_EQ(address[3], 1);
        }
    );
}